

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fStencilTexturingTests.cpp
# Opt level: O3

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_1::UploadTex2DArrayCase::iterate(UploadTex2DArrayCase *this)

{
  IVec3 *this_00;
  IVec3 *this_01;
  RenderContext *pRVar1;
  TestLog *pTVar2;
  code *pcVar3;
  undefined1 auVar4 [8];
  undefined1 auVar5 [8];
  _Alloc_hider _Var6;
  ChannelOrder CVar7;
  bool bVar8;
  int iVar9;
  deUint32 dVar10;
  undefined4 uVar11;
  IndexType IVar12;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ObjectTraits *pOVar13;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TextureFormat *pTVar14;
  long *plVar15;
  void *__dest;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__dest_00;
  undefined4 extraout_var_03;
  TestError *this_02;
  TextureFormat TVar16;
  long *plVar17;
  ConstPixelBufferAccess *access;
  void *__buf;
  char *pcVar18;
  ChannelOrder CVar19;
  int levelNdx;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar20;
  int z;
  int iVar21;
  long lVar22;
  bool local_419;
  undefined1 local_418 [8];
  undefined1 local_410 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_400;
  int local_3f0;
  deUint8 indices [6];
  undefined2 uStack_3e2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3d8;
  float positions [8];
  undefined1 local_3a8 [8];
  undefined1 local_3a0 [4];
  float fStack_39c;
  undefined1 local_398 [20];
  undefined8 local_384;
  float local_37c;
  RenderContext *local_370;
  TextureFormat local_368;
  string local_360;
  undefined1 *local_340;
  ScopedLogSection section;
  size_type local_330;
  undefined1 local_328 [8];
  TextureFormat local_320;
  undefined1 local_318 [8];
  undefined1 auStack_310 [24];
  undefined1 local_2f8 [32];
  PrimitiveType local_2d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2c0;
  pointer pbStack_2a0;
  vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_> local_298;
  undefined1 local_278 [40];
  UploadTex2DArrayCase *local_250;
  Texture depthStencilTex;
  Renderbuffer colorBuf;
  Framebuffer fbo;
  PixelBufferAccess levelAccess;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1d0 [4];
  ios_base local_190 [8];
  ios_base local_188 [32];
  deUint32 local_168;
  bool local_140;
  TextureLevel readLevel;
  TextureLevel uploadLevel;
  
  pRVar1 = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar9 = (*pRVar1->_vptr_RenderContext[3])(pRVar1);
  lVar22 = CONCAT44(extraout_var,iVar9);
  iVar9 = (*pRVar1->_vptr_RenderContext[3])(pRVar1);
  pOVar13 = glu::objectTraits(OBJECTTYPE_FRAMEBUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&fbo.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_00,iVar9),pOVar13);
  local_370 = pRVar1;
  iVar9 = (*pRVar1->_vptr_RenderContext[3])(pRVar1);
  pOVar13 = glu::objectTraits(OBJECTTYPE_RENDERBUFFER);
  glu::ObjectWrapper::ObjectWrapper
            (&colorBuf.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_01,iVar9),pOVar13);
  iVar9 = (*local_370->_vptr_RenderContext[3])();
  pOVar13 = glu::objectTraits(OBJECTTYPE_TEXTURE);
  glu::ObjectWrapper::ObjectWrapper
            (&depthStencilTex.super_ObjectWrapper,(Functions *)CONCAT44(extraout_var_02,iVar9),
             pOVar13);
  levelAccess.super_ConstPixelBufferAccess.m_format = glu::mapGLInternalFormat(this->m_format);
  tcu::TextureLevel::TextureLevel(&uploadLevel,(TextureFormat *)&levelAccess,0x29,0xd,7);
  checkDepthStencilFormatSupport((this->super_TestCase).m_context,this->m_format);
  iVar9 = 0;
  do {
    tcu::TextureLevel::getAccess((PixelBufferAccess *)local_328,&uploadLevel);
    tcu::getSubregion(&levelAccess,(PixelBufferAccess *)local_328,0,0,iVar9,0x29,0xd,1);
    if (iVar9 == 3) {
      renderTestPatternReference(&levelAccess);
    }
    else {
      tcu::clearStencil(&levelAccess,iVar9);
    }
    iVar9 = iVar9 + 1;
  } while (iVar9 != 7);
  (**(code **)(lVar22 + 0xb8))(0x8c1a,depthStencilTex.super_ObjectWrapper.m_object);
  (**(code **)(lVar22 + 0x1398))(0x8c1a,1,this->m_format);
  tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
            (&levelAccess.super_ConstPixelBufferAccess,&uploadLevel);
  glu::texSubImage3D(local_370,0x8c1a,0,0,0,0,&levelAccess.super_ConstPixelBufferAccess);
  dVar10 = (**(code **)(lVar22 + 0x800))();
  glu::checkError(dVar10,"Uploading texture data failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                  ,0x25e);
  (**(code **)(lVar22 + 0xa0))(0x8d41,colorBuf.super_ObjectWrapper.m_object);
  (**(code **)(lVar22 + 0x1238))(0x8d41,0x8236,0x29,0xd);
  (**(code **)(lVar22 + 0x78))(0x8d40,fbo.super_ObjectWrapper.m_object);
  (**(code **)(lVar22 + 0x688))(0x8d40,0x8ce0,0x8d41,colorBuf.super_ObjectWrapper.m_object);
  checkFramebufferStatus(*(Functions **)(lVar22 + 0x170));
  levelAccess.super_ConstPixelBufferAccess.m_format.order = RGBA;
  levelAccess.super_ConstPixelBufferAccess.m_format.type = UNSIGNED_INT32;
  tcu::TextureLevel::TextureLevel(&readLevel,(TextureFormat *)&levelAccess,0x29,0xd,1);
  local_419 = true;
  this_00 = &levelAccess.super_ConstPixelBufferAccess.m_size;
  CVar19 = R;
  local_340 = local_328;
  local_250 = this;
  do {
    pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&levelAccess);
    std::ostream::operator<<((ostringstream *)&levelAccess,CVar19);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&levelAccess);
    std::ios_base::~ios_base(local_190);
    pTVar14 = (TextureFormat *)
              std::__cxx11::string::replace((ulong)local_418,0,(char *)0x0,0x9a4685);
    local_328 = (undefined1  [8])((long)local_328 + 0x10);
    TVar16 = (TextureFormat)(pTVar14 + 2);
    if (*pTVar14 == TVar16) {
      local_318 = *(undefined1 (*) [8])TVar16;
      auStack_310._0_8_ = pTVar14[3];
    }
    else {
      local_318 = *(undefined1 (*) [8])TVar16;
      local_328 = (undefined1  [8])*pTVar14;
    }
    local_320 = pTVar14[1];
    *pTVar14 = TVar16;
    pTVar14[1].order = R;
    pTVar14[1].type = SNORM_INT8;
    *(undefined1 *)&pTVar14[2].order = R;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)&levelAccess);
    std::ostream::operator<<((ostringstream *)&levelAccess,CVar19);
    std::__cxx11::stringbuf::str();
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)&levelAccess);
    std::ios_base::~ios_base(local_190);
    plVar15 = (long *)std::__cxx11::string::replace((ulong)positions,0,(char *)0x0,0x972941);
    local_3a8 = (undefined1  [8])local_398;
    plVar17 = plVar15 + 2;
    if ((long *)*plVar15 == plVar17) {
      local_398._8_8_ = plVar15[3];
      local_398._0_4_ = (undefined4)*plVar17;
      local_398._4_4_ = (undefined4)((ulong)*plVar17 >> 0x20);
    }
    else {
      local_398._0_4_ = (undefined4)*plVar17;
      local_398._4_4_ = (undefined4)((ulong)*plVar17 >> 0x20);
      local_3a8 = (undefined1  [8])*plVar15;
    }
    local_3a0 = SUB84(plVar15[1],0);
    fStack_39c = (float)((ulong)plVar15[1] >> 0x20);
    *plVar15 = (long)plVar17;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    tcu::ScopedLogSection::ScopedLogSection(&section,pTVar2,(string *)local_328,(string *)local_3a8)
    ;
    if (local_3a8 != (undefined1  [8])local_398) {
      operator_delete((void *)local_3a8,CONCAT44(local_398._4_4_,local_398._0_4_) + 1);
    }
    if ((float *)positions._0_8_ != positions + 4) {
      operator_delete((void *)positions._0_8_,positions._16_8_ + 1);
    }
    if (local_328 != (undefined1  [8])((long)local_328 + 0x10)) {
      operator_delete((void *)local_328,(long)local_318 + 1);
    }
    if (local_418 != (undefined1  [8])((long)local_410 + 8)) {
      operator_delete((void *)local_418,CONCAT26(local_410._14_2_,local_410._8_6_) + 1);
    }
    dVar10 = depthStencilTex.super_ObjectWrapper.m_object;
    memset(local_328,0,0xac);
    local_278._0_8_ = (pointer)0x0;
    local_278[8] = 0;
    local_278._9_7_ = 0;
    local_278[0x10] = 0;
    local_278._17_8_ = 0;
    positions._0_8_ = positions + 4;
    local_3a8 = (undefined1  [8])0xa9;
    __dest = (void *)std::__cxx11::string::_M_create((ulong *)positions,(ulong)local_3a8);
    auVar4 = local_3a8;
    positions[4] = (float)local_3a8._0_4_;
    positions[5] = (float)local_3a8._4_4_;
    positions._0_8_ = __dest;
    memcpy(__dest,
           "#version 300 es\nin highp vec4 a_position;\nin highp vec3 a_texCoord;\nout highp vec3 v_texCoord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_texCoord = a_texCoord;\n}\n"
           ,0xa9);
    auVar5 = local_3a8;
    local_3a8._0_4_ = auVar4._0_4_;
    local_3a8._4_4_ = auVar4._4_4_;
    positions[2] = (float)local_3a8._0_4_;
    positions[3] = (float)local_3a8._4_4_;
    *(char *)((long)__dest + (long)auVar4) = '\0';
    local_418 = (undefined1  [8])((ulong)local_418 & 0xffffffff00000000);
    local_410._0_8_ = &local_400;
    local_3a8 = auVar5;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_410,positions._0_8_,(pointer)((long)auVar4 + positions._0_8_));
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_328 + ((ulong)local_418 & 0xffffffff) * 0x18),(value_type *)local_410);
    _indices = (pointer)&local_3d8;
    local_360._M_dataplus._M_p = (pointer)0xc6;
    __dest_00 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)std::__cxx11::string::_M_create((ulong *)indices,(ulong)&local_360);
    _Var6._M_p = local_360._M_dataplus._M_p;
    local_3d8._M_allocated_capacity = (size_type)local_360._M_dataplus._M_p;
    _indices = (pointer)__dest_00;
    memcpy(__dest_00,
           "#version 300 es\nuniform highp usampler2DArray u_sampler;\nin highp vec3 v_texCoord;\nlayout(location = 0) out highp uint o_stencil;\nvoid main (void)\n{\n\to_stencil = texture(u_sampler, v_texCoord).x;\n}\n"
           ,0xc6);
    __dest_00->_M_local_buf[(long)_Var6._M_p] = '\0';
    local_3a8._0_4_ = 1;
    _local_3a0 = local_398 + 8;
    std::__cxx11::string::_M_construct<char*>((string *)local_3a0,_indices,_Var6._M_p + _indices);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_328 + ((ulong)local_3a8 & 0xffffffff) * 0x18),(value_type *)local_3a0);
    glu::ShaderProgram::ShaderProgram
              ((ShaderProgram *)&levelAccess,local_370,(ProgramSources *)local_328);
    if (_local_3a0 != local_398 + 8) {
      operator_delete(_local_3a0,local_398._8_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_indices != &local_3d8) {
      operator_delete(_indices,local_3d8._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._0_8_ != &local_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(local_400._M_local_buf[7],
                               CONCAT16(local_400._M_local_buf[6],
                                        local_400._M_allocated_capacity._0_6_)) + 1);
    }
    if ((float *)positions._0_8_ != positions + 4) {
      operator_delete((void *)positions._0_8_,positions._16_8_ + 1);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_278);
    std::vector<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>::~vector
              (&local_298);
    lVar22 = 0x78;
    do {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)(local_328 + lVar22));
      lVar22 = lVar22 + -0x18;
    } while (lVar22 != -0x18);
    positions[4] = -1.0;
    positions[5] = 1.0;
    positions[6] = 1.0;
    positions[7] = 1.0;
    local_3a0 = (undefined1  [4])(float)(int)CVar19;
    positions[0] = -1.0;
    positions[1] = -1.0;
    positions[2] = 1.0;
    positions[3] = -1.0;
    local_3a8 = (undefined1  [8])0x0;
    fStack_39c = 1.0;
    local_398._0_4_ = 0.0;
    local_398._8_8_ = 0x3f80000000000000;
    local_384 = 0x3f8000003f800000;
    _indices = (pointer)&local_3d8;
    local_3d8._M_allocated_capacity = 0x697469736f705f61;
    local_3d8._8_2_ = 0x6e6f;
    local_3d8._M_local_buf[10] = '\0';
    local_418._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
    local_410._0_8_ = &local_400;
    local_398._4_4_ = local_3a0;
    local_398._16_4_ = local_3a0;
    local_37c = (float)local_3a0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_410,_indices,local_3d8._M_local_buf + 10);
    local_3f0 = 0;
    local_328._0_4_ = local_418._0_4_;
    local_320 = (TextureFormat)(local_318 + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)(local_328 + 8),local_410._0_8_,
               (char *)(local_410._0_8_ + CONCAT26(local_410._14_2_,local_410._8_6_)));
    auStack_310._16_4_ = local_3f0;
    local_2f8._0_4_ = VTX_COMP_FLOAT;
    local_2f8._4_4_ = VTX_COMP_CONVERT_NONE;
    local_2f8._8_4_ = 2;
    local_2f8._12_4_ = 4;
    local_2f8._16_4_ = 0;
    local_2f8._24_8_ = positions;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._0_8_ != &local_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(local_400._M_local_buf[7],
                               CONCAT16(local_400._M_local_buf[6],
                                        local_400._M_allocated_capacity._0_6_)) + 1);
    }
    local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
    local_360.field_2._M_allocated_capacity = 0x6f6f437865745f61;
    local_360.field_2._8_2_ = 0x6472;
    local_360._M_string_length = 10;
    local_360.field_2._M_local_buf[10] = '\0';
    local_418._0_4_ = PRIMITIVETYPE_TRIANGLE_STRIP;
    local_410._0_8_ = &local_400;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_410,local_360._M_dataplus._M_p,
               (undefined1 *)((long)&local_360.field_2 + 10));
    local_3f0 = 0;
    local_2d8 = local_418._0_4_;
    local_2d0[0] = &local_2c0;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_2d0,local_410._0_8_,
               (char *)(local_410._0_8_ + CONCAT26(local_410._14_2_,local_410._8_6_)));
    local_2c0.field_2._M_allocated_capacity._0_4_ = local_3f0;
    local_2c0.field_2._8_8_ = (pointer)0x8;
    pbStack_2a0 = (pointer)0x400000003;
    local_298.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_start._0_4_ = 0;
    local_298.
    super__Vector_base<glu::AttribLocationBinding,_std::allocator<glu::AttribLocationBinding>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)local_3a8;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_410._0_8_ != &local_400) {
      operator_delete((void *)local_410._0_8_,
                      CONCAT17(local_400._M_local_buf[7],
                               CONCAT16(local_400._M_local_buf[6],
                                        local_400._M_allocated_capacity._0_6_)) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_360._M_dataplus._M_p != &local_360.field_2) {
      operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)_indices != &local_3d8) {
      operator_delete(_indices,local_3d8._M_allocated_capacity + 1);
    }
    indices[0] = '\0';
    indices[1] = '\0';
    indices[2] = '\0';
    indices[3] = '\0';
    indices[4] = '\x01';
    indices[5] = '\x03';
    indices[0] = '\0';
    indices[1] = '\x01';
    indices[2] = '\x02';
    indices[3] = '\x02';
    iVar9 = (*local_370->_vptr_RenderContext[3])();
    lVar22 = CONCAT44(extraout_var_03,iVar9);
    if (local_140 == false) {
      this_02 = (TestError *)__cxa_allocate_exception(0x38);
      local_418 = (undefined1  [8])((long)local_410 + 8);
      local_410._8_6_ = 0x6c69706d6f43;
      local_410._14_2_ = 0x2065;
      local_400._M_allocated_capacity._0_6_ = 0x64656c696166;
      local_410._0_8_ = (pointer)0xe;
      local_400._M_local_buf[6] = '\0';
      tcu::TestError::TestError(this_02,(string *)local_418);
      __cxa_throw(this_02,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
    }
    (**(code **)(lVar22 + 8))(0x84c0);
    (**(code **)(lVar22 + 0xb8))(0x8c1a,dVar10);
    (**(code **)(lVar22 + 0x1360))(0x8c1a,0x2801,0x2600);
    (**(code **)(lVar22 + 0x1360))(0x8c1a,0x2800,0x2600);
    (**(code **)(lVar22 + 0x1360))(0x8c1a,0x90ea,0x1901);
    dVar10 = (**(code **)(lVar22 + 0x800))();
    glu::checkError(dVar10,"Texture state setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                    ,0x13e);
    (**(code **)(lVar22 + 0x1680))(local_168);
    pcVar3 = *(code **)(lVar22 + 0x14f0);
    uVar11 = (**(code **)(lVar22 + 0xb48))(local_168,"u_sampler");
    (*pcVar3)(uVar11,0);
    dVar10 = (**(code **)(lVar22 + 0x800))();
    glu::checkError(dVar10,"Program setup failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fStencilTexturingTests.cpp"
                    ,0x142);
    (**(code **)(lVar22 + 0x1a00))(0,0,0x29,0xd);
    local_418._0_4_ = R;
    local_418._4_4_ = UNORM_INT32;
    local_410._0_8_ = local_410._0_8_ & 0xffffffff00000000;
    local_410._8_6_ = SUB86(indices,0);
    local_410._14_2_ = (undefined2)((ulong)indices >> 0x30);
    glu::draw(local_370,local_168,2,(VertexArrayBinding *)local_328,(PrimitiveList *)local_418,
              (DrawUtilCallback *)0x0);
    lVar22 = -0xa0;
    pbVar20 = &local_2c0;
    do {
      if (pbVar20 !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
          pbVar20[-1].field_2._M_allocated_capacity) {
        operator_delete((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        pbVar20[-1].field_2._M_allocated_capacity,
                        (ulong)((pbVar20->_M_dataplus)._M_p + 1));
      }
      pbVar20 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                &pbVar20[-3].field_2;
      lVar22 = lVar22 + 0x50;
    } while (lVar22 != 0);
    glu::ShaderProgram::~ShaderProgram((ShaderProgram *)&levelAccess);
    tcu::PixelBufferAccess::PixelBufferAccess(&levelAccess,&readLevel);
    glu::readPixels(local_370,0,0,&levelAccess);
    if (CVar19 == L) {
      local_328._0_4_ = S;
      local_328._4_4_ = UNSIGNED_INT8;
      tcu::TextureLevel::TextureLevel
                ((TextureLevel *)&levelAccess,(TextureFormat *)local_328,0x29,0xd,1);
      tcu::PixelBufferAccess::PixelBufferAccess
                ((PixelBufferAccess *)local_328,(TextureLevel *)&levelAccess);
      renderTestPatternReference((PixelBufferAccess *)local_328);
      pTVar2 = ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_328,(TextureLevel *)&levelAccess);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_418,&readLevel);
      bVar8 = compareStencilToRed(pTVar2,(ConstPixelBufferAccess *)local_328,
                                  (ConstPixelBufferAccess *)local_418);
      tcu::TextureLevel::~TextureLevel((TextureLevel *)&levelAccess);
    }
    else {
      local_368 = (TextureFormat)
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                ((ConstPixelBufferAccess *)local_418,&readLevel);
      if ((int)local_410._4_4_ < 1) {
        iVar9 = 0;
      }
      else {
        z = 0;
        iVar9 = 0;
        iVar21 = local_410._4_4_;
        IVar12 = local_410._0_4_;
        do {
          if (0 < (int)IVar12) {
            iVar21 = 0;
            do {
              tcu::ConstPixelBufferAccess::getPixelInt
                        (&levelAccess.super_ConstPixelBufferAccess,(int)local_418,iVar21,z);
              CVar7 = levelAccess.super_ConstPixelBufferAccess.m_format.order;
              if (levelAccess.super_ConstPixelBufferAccess.m_format.order != CVar19) {
                if (iVar9 < 10) {
                  levelAccess.super_ConstPixelBufferAccess.m_format = local_368;
                  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)this_00,"ERROR: Expected ",0x10);
                  std::ostream::operator<<(this_00,CVar19);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", got ",6);
                  std::ostream::operator<<(this_00,CVar7);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," at (",5);
                  std::ostream::operator<<(this_00,iVar21);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
                  std::ostream::operator<<(this_00,z);
                  std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")",1);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&levelAccess,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
LAB_0047f596:
                  std::__cxx11::ostringstream::~ostringstream
                            ((ostringstream *)&levelAccess.super_ConstPixelBufferAccess.m_size);
                  std::ios_base::~ios_base(local_188);
                }
                else if (iVar9 == 10) {
                  levelAccess.super_ConstPixelBufferAccess.m_format = local_368;
                  std::__cxx11::ostringstream::ostringstream
                            ((ostringstream *)&levelAccess.super_ConstPixelBufferAccess.m_size);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&levelAccess.super_ConstPixelBufferAccess.m_size,"...",3);
                  tcu::MessageBuilder::operator<<
                            ((MessageBuilder *)&levelAccess,
                             (EndMessageToken *)&tcu::TestLog::EndMessage);
                  goto LAB_0047f596;
                }
                iVar9 = iVar9 + 1;
              }
              iVar21 = iVar21 + 1;
            } while (iVar21 < (int)local_410._0_4_);
            iVar21 = local_410._4_4_;
            IVar12 = local_410._0_4_;
          }
          z = z + 1;
        } while (z < iVar21);
      }
      levelAccess.super_ConstPixelBufferAccess.m_format = local_368;
      std::__cxx11::ostringstream::ostringstream
                ((ostringstream *)&levelAccess.super_ConstPixelBufferAccess.m_size);
      this = local_250;
      this_01 = &levelAccess.super_ConstPixelBufferAccess.m_size;
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,"Found ",6);
      std::ostream::operator<<(this_01,iVar9);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_01," faulty pixels, comparison ",0x1b);
      bVar8 = iVar9 == 0;
      pcVar18 = "FAILED!";
      if (bVar8) {
        pcVar18 = "passed.";
      }
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_01,pcVar18,7);
      tcu::MessageBuilder::operator<<
                ((MessageBuilder *)&levelAccess,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_01);
      std::ios_base::~ios_base(local_188);
      local_3a8 = (undefined1  [8])local_398;
      levelAccess.super_ConstPixelBufferAccess.m_format.order = sBGR;
      levelAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      local_3a8 = (undefined1  [8])
                  std::__cxx11::string::_M_create((ulong *)local_3a8,(ulong)&levelAccess);
      local_398._0_4_ = levelAccess.super_ConstPixelBufferAccess.m_format.order;
      local_398._4_4_ = levelAccess.super_ConstPixelBufferAccess.m_format.type;
      builtin_strncpy((char *)local_3a8,"ComparisonResult",0x10);
      *(char *)((long)local_3a8 + (long)levelAccess.super_ConstPixelBufferAccess.m_format) = '\0';
      positions._0_8_ = positions + 4;
      levelAccess.super_ConstPixelBufferAccess.m_format.order = DS|L;
      levelAccess.super_ConstPixelBufferAccess.m_format.type = SNORM_INT8;
      local_3a0 = (undefined1  [4])local_398._0_4_;
      fStack_39c = (float)local_398._4_4_;
      positions._0_8_ = std::__cxx11::string::_M_create((ulong *)positions,(ulong)&levelAccess);
      positions[4] = (float)levelAccess.super_ConstPixelBufferAccess.m_format.order;
      positions[5] = (float)levelAccess.super_ConstPixelBufferAccess.m_format.type;
      builtin_strncpy((char *)positions._0_8_,"Image comparison result",0x17);
      positions[2] = (float)levelAccess.super_ConstPixelBufferAccess.m_format.order;
      positions[3] = (float)levelAccess.super_ConstPixelBufferAccess.m_format.type;
      *(char *)(positions._0_8_ + (long)levelAccess.super_ConstPixelBufferAccess.m_format) = '\0';
      tcu::LogImageSet::LogImageSet
                ((LogImageSet *)local_328,(string *)local_3a8,(string *)positions);
      tcu::TestLog::startImageSet((TestLog *)local_368,(char *)local_328,(char *)auStack_310._8_8_);
      _indices = (pointer)&local_3d8;
      local_3d8._M_allocated_capacity._0_7_ = 0x746c75736552;
      local_360._M_dataplus._M_p = (pointer)&local_360.field_2;
      local_330 = 0x15;
      local_360._M_dataplus._M_p =
           (pointer)std::__cxx11::string::_M_create((ulong *)&local_360,(ulong)&local_330);
      local_360.field_2._M_allocated_capacity = local_330;
      *(undefined8 *)local_360._M_dataplus._M_p = 0x7320746c75736552;
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 8) = 't';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 9) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 10) = 'n';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0xb) = 'c';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0xc) = 'i';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0xd) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0xe) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0xf) = 'b';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0xd) = 'l';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0xe) = ' ';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0xf) = 'b';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0x10) = 'u';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0x11) = 'f';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0x12) = 'f';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0x13) = 'e';
      *(char *)((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_360._M_dataplus._M_p + 0x14) = 'r';
      local_360._M_string_length = local_330;
      local_360._M_dataplus._M_p[local_330] = '\0';
      access = (ConstPixelBufferAccess *)local_418;
      tcu::LogImage::LogImage
                ((LogImage *)&levelAccess,(string *)indices,&local_360,access,
                 QP_IMAGE_COMPRESSION_MODE_BEST);
      tcu::LogImage::write((LogImage *)&levelAccess,local_368.order,__buf,(size_t)access);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)levelAccess.super_ConstPixelBufferAccess.m_data != local_1d0) {
        operator_delete(levelAccess.super_ConstPixelBufferAccess.m_data,
                        local_1d0[0]._M_allocated_capacity + 1);
      }
      if (levelAccess.super_ConstPixelBufferAccess.m_format !=
          (TextureFormat)(levelAccess.super_ConstPixelBufferAccess.m_size.m_data + 2)) {
        operator_delete((void *)levelAccess.super_ConstPixelBufferAccess.m_format,
                        levelAccess.super_ConstPixelBufferAccess._16_8_ + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_360._M_dataplus._M_p != &local_360.field_2) {
        operator_delete(local_360._M_dataplus._M_p,local_360.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)_indices != &local_3d8) {
        operator_delete(_indices,local_3d8._M_allocated_capacity + 1);
      }
      if ((pointer)auStack_310._8_8_ != (pointer)(auStack_310 + 0x18)) {
        operator_delete((void *)auStack_310._8_8_,CONCAT44(local_2f8._4_4_,local_2f8._0_4_) + 1);
      }
      if (local_328 != (undefined1  [8])((long)local_328 + 0x10)) {
        operator_delete((void *)local_328,(long)local_318 + 1);
      }
      if ((float *)positions._0_8_ != positions + 4) {
        operator_delete((void *)positions._0_8_,positions._16_8_ + 1);
      }
      if (local_3a8 != (undefined1  [8])local_398) {
        operator_delete((void *)local_3a8,CONCAT44(local_398._4_4_,local_398._0_4_) + 1);
      }
      tcu::TestLog::endImageSet((TestLog *)local_368);
    }
    tcu::TestLog::endSection(section.m_log);
    if (bVar8 == false) {
      pcVar18 = "Image comparison failed";
      goto LAB_0047f9ba;
    }
    local_419 = CVar19 < RA;
    CVar19 = CVar19 + A;
    if (CVar19 == RGB) {
      pcVar18 = "Pass";
LAB_0047f9ba:
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)local_419,
                 pcVar18);
      tcu::TextureLevel::~TextureLevel(&readLevel);
      tcu::TextureLevel::~TextureLevel(&uploadLevel);
      glu::ObjectWrapper::~ObjectWrapper(&depthStencilTex.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&colorBuf.super_ObjectWrapper);
      glu::ObjectWrapper::~ObjectWrapper(&fbo.super_ObjectWrapper);
      return STOP;
    }
  } while( true );
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&	renderCtx			= m_context.getRenderContext();
		const glw::Functions&		gl					= renderCtx.getFunctions();
		const int					width				= 41;
		const int					height				= 13;
		const int					levels				= 7;
		const int					ptrnLevel			= 3;
		glu::Framebuffer			fbo					(renderCtx);
		glu::Renderbuffer			colorBuf			(renderCtx);
		glu::Texture				depthStencilTex		(renderCtx);
		TextureLevel				uploadLevel			(glu::mapGLInternalFormat(m_format), width, height, levels);

		checkDepthStencilFormatSupport(m_context, m_format);

		for (int levelNdx = 0; levelNdx < levels; levelNdx++)
		{
			const tcu::PixelBufferAccess levelAccess = tcu::getSubregion(uploadLevel.getAccess(), 0, 0, levelNdx, width, height, 1);

			if (levelNdx == ptrnLevel)
				renderTestPatternReference(levelAccess);
			else
				tcu::clearStencil(levelAccess, levelNdx);
		}

		gl.bindTexture(GL_TEXTURE_2D_ARRAY, *depthStencilTex);
		gl.texStorage3D(GL_TEXTURE_2D_ARRAY, 1, m_format, width, height, levels);
		glu::texSubImage3D(renderCtx, GL_TEXTURE_2D_ARRAY, 0, 0, 0, 0, uploadLevel);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Uploading texture data failed");

		gl.bindRenderbuffer(GL_RENDERBUFFER, *colorBuf);
		gl.renderbufferStorage(GL_RENDERBUFFER, GL_R32UI, width, height);

		gl.bindFramebuffer(GL_FRAMEBUFFER, *fbo);
		gl.framebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, *colorBuf);
		checkFramebufferStatus(gl);

		{
			TextureLevel	readLevel		(TextureFormat(TextureFormat::RGBA, TextureFormat::UNSIGNED_INT32), width, height);
			bool			allLevelsOk		= true;

			for (int levelNdx = 0; levelNdx < levels; levelNdx++)
			{
				tcu::ScopedLogSection section(m_testCtx.getLog(), "Level" + de::toString(levelNdx), "Level " + de::toString(levelNdx));
				bool levelOk;

				blitStencilToColor2DArray(renderCtx, *depthStencilTex, width, height, levelNdx);
				glu::readPixels(renderCtx, 0, 0, readLevel);

				if (levelNdx == ptrnLevel)
				{
					TextureLevel reference(TextureFormat(TextureFormat::S, TextureFormat::UNSIGNED_INT8), width, height);
					renderTestPatternReference(reference);

					levelOk = compareStencilToRed(m_testCtx.getLog(), reference, readLevel);
				}
				else
					levelOk = compareRedChannel(m_testCtx.getLog(), readLevel, levelNdx);

				if (!levelOk)
				{
					allLevelsOk = false;
					break;
				}
			}

			m_testCtx.setTestResult(allLevelsOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									allLevelsOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}